

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurve::~IfcDimensionCurve(IfcDimensionCurve *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcAnnotationCurveOccurrence.super_IfcAnnotationOccurrence.super_IfcStyledItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x18 = 0x97baa8;
  (this->super_IfcAnnotationCurveOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x97baf8;
  *(undefined8 *)
   &this[-1].super_IfcAnnotationCurveOccurrence.super_IfcAnnotationOccurrence.super_IfcStyledItem.
    field_0x38 = 0x97bad0;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcAnnotationCurveOccurrence.super_IfcAnnotationOccurrence.
             super_IfcStyledItem.field_0x70;
  if (puVar1 != &this[-1].super_IfcAnnotationCurveOccurrence.super_IfcAnnotationOccurrence.
                 super_IfcStyledItem.field_0x80) {
    operator_delete(puVar1);
  }
  pvVar2 = (void *)this[-1].super_IfcAnnotationCurveOccurrence.super_IfcAnnotationOccurrence.
                   super_IfcStyledItem.Name.ptr.field_2._M_allocated_capacity;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  operator_delete(&this[-1].super_IfcAnnotationCurveOccurrence.super_IfcAnnotationOccurrence.
                   super_IfcStyledItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x18);
  return;
}

Assistant:

IfcDimensionCurve() : Object("IfcDimensionCurve") {}